

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> *
chrono::Qdt_from_Wabs
          (ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *w,ChQuaternion<double> *q)

{
  ChQuaternion<double> *result;
  undefined1 auVar1 [32];
  undefined1 local_50 [32];
  ChQuaternion<double> local_30;
  
  local_30.m_data[0] = 0.0;
  local_30.m_data[1] = w->m_data[0];
  local_30.m_data[2] = w->m_data[1];
  local_30.m_data[3] = w->m_data[2];
  Qcross(&local_30,q);
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar1._16_8_ = 0x3fe0000000000000;
  auVar1._24_8_ = 0x3fe0000000000000;
  auVar1 = vmulpd_avx512vl(local_50,auVar1);
  *(undefined1 (*) [32])__return_storage_ptr__->m_data = auVar1;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Qdt_from_Wabs(const ChVector<double>& w, const ChQuaternion<double>& q) {
    ChQuaternion<double> qw;
    double half = 0.5;

    qw.e0() = 0;
    qw.e1() = w.x();
    qw.e2() = w.y();
    qw.e3() = w.z();

    return Qscale(Qcross(qw, q), half);  // {q_dt} = 1/2 {0,w}*{q}
}